

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * __thiscall
QUtil::double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,QUtil *this,double num,int decimal_places,
          bool trim_trailing_zeroes)

{
  _Setprecision _Var1;
  ostream *this_00;
  void *this_01;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  locale local_1a0 [8];
  ostringstream local_198 [8];
  ostringstream buf;
  int local_1c;
  bool trim_trailing_zeroes_local;
  int decimal_places_local;
  double num_local;
  string *result;
  
  local_1c = (int)this;
  if (local_1c < 1) {
    local_1c = 6;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::locale::classic();
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  _Var1 = std::setprecision(local_1c);
  this_00 = std::operator<<((ostream *)local_198,_Var1);
  this_01 = (void *)std::ostream::operator<<(this_00,std::fixed);
  std::ostream::operator<<(this_01,num);
  std::__cxx11::ostringstream::str();
  if ((decimal_places & 1U) != 0) {
    while( true ) {
      uVar2 = std::__cxx11::string::length();
      bVar4 = false;
      if (1 < uVar2) {
        pcVar3 = (char *)std::__cxx11::string::back();
        bVar4 = *pcVar3 == '0';
      }
      if (!bVar4) break;
      std::__cxx11::string::pop_back();
    }
    uVar2 = std::__cxx11::string::length();
    if ((1 < uVar2) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 == '.')) {
      std::__cxx11::string::pop_back();
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::double_to_string(double num, int decimal_places, bool trim_trailing_zeroes)
{
    // Backward compatibility -- this code used to use sprintf and treated decimal_places <= 0 to
    // mean to use the default, which was six decimal places. Starting in 10.2, we trim trailing
    // zeroes by default.
    if (decimal_places <= 0) {
        decimal_places = 6;
    }
    std::ostringstream buf;
    buf.imbue(std::locale::classic());
    buf << std::setprecision(decimal_places) << std::fixed << num;
    std::string result = buf.str();
    if (trim_trailing_zeroes) {
        while ((result.length() > 1) && (result.back() == '0')) {
            result.pop_back();
        }
        if ((result.length() > 1) && (result.back() == '.')) {
            result.pop_back();
        }
    }
    return result;
}